

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

Test * __thiscall
testing::internal::
TestFactoryImpl<(anonymous_namespace)::ktxTexture1WriteKTX2TestRGB8_Write2DMipmapUnrecognizedMetadata2_Test>
::CreateTest(TestFactoryImpl<(anonymous_namespace)::ktxTexture1WriteKTX2TestRGB8_Write2DMipmapUnrecognizedMetadata2_Test>
             *this)

{
  ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U> *this_00;
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  
  this_00 = (ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U> *)operator_new(0x188);
  anon_unknown.dwarf_bfba::ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U>::
  ktxTexture1WriteTestBase(this_00);
  uVar1 = 4;
  uVar3 = 3;
  do {
    uVar2 = uVar3;
    uVar3 = (uint)(uVar1 % (ulong)uVar2);
    uVar1 = (ulong)uVar2;
  } while (uVar3 != 0);
  *(int *)&this_00[1].super_Test._vptr_Test = (int)(0xc / (ulong)uVar2);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__ktxTexture1WriteTestBase_0019c660;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }